

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O0

RPCHelpMan * wallet::listlabels(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff758;
  RPCArg *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff760;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff790;
  allocator<char> *in_stack_fffffffffffff798;
  iterator in_stack_fffffffffffff7a0;
  RPCArgOptions *in_stack_fffffffffffff7a8;
  string *in_stack_fffffffffffff7b0;
  Fallback *in_stack_fffffffffffff7b8;
  undefined1 skip_type_check;
  RPCHelpMan *pRVar1;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff7c0;
  RPCHelpMan *pRVar2;
  string *in_stack_fffffffffffff7c8;
  RPCArg *in_stack_fffffffffffff7d0;
  RPCExamples *pRVar3;
  RPCResults *in_stack_fffffffffffff7d8;
  RPCExamples *pRVar4;
  RPCResult *in_stack_fffffffffffff7e0;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  undefined7 in_stack_fffffffffffff8b8;
  undefined1 uVar5;
  allocator<char> local_6e1;
  allocator<char> local_6e0;
  allocator<char> local_6df;
  allocator<char> local_6de;
  allocator<char> local_6dd;
  allocator<char> local_6dc;
  allocator<char> local_6db;
  allocator<char> local_6da [2];
  pointer local_6d8;
  pointer pRStack_6d0;
  undefined1 local_6c8 [23];
  allocator<char> local_6b1 [31];
  allocator<char> local_692;
  allocator<char> local_691 [32];
  allocator<char> local_671;
  undefined4 local_670;
  allocator<char> local_669 [31];
  allocator<char> local_64a;
  allocator<char> local_649 [9];
  _Alloc_hider in_stack_fffffffffffff9c0;
  RPCExamples local_388 [4];
  RPCExamples local_300 [6];
  undefined1 local_238;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  RPCHelpMan local_150;
  _Alloc_hider local_8;
  
  local_8._M_p = *(pointer *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  pRVar2 = &local_150;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_670._0_1_ = '\x01';
  local_670._1_3_ = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff768,(Optional *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_238 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff770);
  local_210 = 0;
  uStack_208 = 0;
  local_200 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff758);
  local_1f8 = 0;
  local_1f7 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                 (Type)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,
                 in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff7b8 >> 0x38);
  uVar5 = 0;
  pRVar1 = &local_150;
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff758);
  __l._M_len = (size_type)in_stack_fffffffffffff7a8;
  __l._M_array = in_stack_fffffffffffff7a0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff798,__l,
             (allocator_type *)in_stack_fffffffffffff790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  pRVar4 = local_388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_6d8 = (pointer)0x0;
  pRStack_6d0 = (pointer)0x0;
  local_6c8._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff758);
  RPCResult::RPCResult
            (in_stack_fffffffffffff7e0,(Type)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
             &in_stack_fffffffffffff7d0->m_names,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
             ,(bool)skip_type_check);
  pRVar3 = local_388;
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)0x1;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff758);
  __l_00._M_len = (size_type)in_stack_fffffffffffff7a8;
  __l_00._M_array = (iterator)in_stack_fffffffffffff7a0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff798,__l_00,
             (allocator_type *)in_stack_fffffffffffff790);
  RPCResult::RPCResult
            (in_stack_fffffffffffff7e0,(Type)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
             &in_stack_fffffffffffff7d0->m_names,in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff7d8,(RPCResult *)in_stack_fffffffffffff7d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleCli(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+((char *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  std::operator+(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleCli(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleCli(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff7a8,(char *)in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  HelpExampleRpc(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  std::operator+(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff758,(string *)0x4c88cb);
  this = (RPCArg *)&stack0xfffffffffffff8f8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listlabels()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff768,in_stack_fffffffffffff760);
  RPCHelpMan::RPCHelpMan
            (pRVar1,&pRVar2->m_name,(string *)CONCAT17(uVar5,in_stack_fffffffffffff8b8),args,
             (RPCResults *)pRVar3,pRVar4,(RPCMethodImpl *)in_stack_fffffffffffff9c0._M_p);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6e0);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6df);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6de);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6dd);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6dc);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_6db);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6da);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff768);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  pRVar4 = local_388;
  pRVar3 = local_300;
  do {
    pRVar3 = (RPCExamples *)((long)&pRVar3[-5].m_examples.field_2 + 8);
    RPCResult::~RPCResult((RPCResult *)this);
  } while (pRVar3 != pRVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff768);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_6c8 + 0x16));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_6b1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_692);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_691);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff768);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  pRVar2 = &local_150;
  pRVar1 = (RPCHelpMan *)&stack0xffffffffffffffb8;
  do {
    pRVar1 = (RPCHelpMan *)
             &pRVar1[-2].m_args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
              super__Vector_impl_data._M_finish;
    RPCArg::~RPCArg(this);
  } while (pRVar1 != pRVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_671);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_669);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_64a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_649);
  if (*(pointer *)(in_FS_OFFSET + 0x28) == local_8._M_p) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listlabels()
{
    return RPCHelpMan{"listlabels",
                "\nReturns the list of all labels, or labels that are assigned to addresses with a specific purpose.\n",
                {
                    {"purpose", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "Address purpose to list labels for ('send','receive'). An empty string is the same as not providing this argument."},
                },
                RPCResult{
                    RPCResult::Type::ARR, "", "",
                    {
                        {RPCResult::Type::STR, "label", "Label name"},
                    }
                },
                RPCExamples{
            "\nList all labels\n"
            + HelpExampleCli("listlabels", "") +
            "\nList labels that have receiving addresses\n"
            + HelpExampleCli("listlabels", "receive") +
            "\nList labels that have sending addresses\n"
            + HelpExampleCli("listlabels", "send") +
            "\nAs a JSON-RPC call\n"
            + HelpExampleRpc("listlabels", "receive")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    LOCK(pwallet->cs_wallet);

    std::optional<AddressPurpose> purpose;
    if (!request.params[0].isNull()) {
        std::string purpose_str = request.params[0].get_str();
        if (!purpose_str.empty()) {
            purpose = PurposeFromString(purpose_str);
            if (!purpose) {
                throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid 'purpose' argument, must be a known purpose string, typically 'send', or 'receive'.");
            }
        }
    }

    // Add to a set to sort by label name, then insert into Univalue array
    std::set<std::string> label_set = pwallet->ListAddrBookLabels(purpose);

    UniValue ret(UniValue::VARR);
    for (const std::string& name : label_set) {
        ret.push_back(name);
    }

    return ret;
},
    };
}